

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O1

void Aig_ManPrintVerbose(Aig_Man_t *p,int fHaig)

{
  Vec_Ptr_t *__ptr;
  undefined8 uVar1;
  long lVar2;
  
  printf("PIs: ");
  if (0 < p->vCis->nSize) {
    lVar2 = 0;
    do {
      printf(" %p");
      lVar2 = lVar2 + 1;
    } while (lVar2 < p->vCis->nSize);
  }
  putchar(10);
  uVar1 = 0;
  __ptr = Aig_ManDfs(p,0);
  if (0 < __ptr->nSize) {
    lVar2 = 0;
    do {
      Aig_ObjPrintVerbose((Aig_Obj_t *)__ptr->pArray[lVar2],(int)uVar1);
      putchar(10);
      lVar2 = lVar2 + 1;
    } while (lVar2 < __ptr->nSize);
  }
  putchar(10);
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (void **)0x0;
  }
  if (__ptr != (Vec_Ptr_t *)0x0) {
    free(__ptr);
    return;
  }
  return;
}

Assistant:

void Aig_ManPrintVerbose( Aig_Man_t * p, int fHaig )
{
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj;
    int i;
    printf( "PIs: " );
    Aig_ManForEachCi( p, pObj, i )
        printf( " %p", pObj );
    printf( "\n" );
    vNodes = Aig_ManDfs( p, 0 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        Aig_ObjPrintVerbose( pObj, fHaig ), printf( "\n" );
    printf( "\n" );
    Vec_PtrFree( vNodes );
}